

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O3

void testing::internal::XmlUnitTestResultPrinter::OutputXmlCDataSection(ostream *stream,char *data)

{
  char *pcVar1;
  size_t sVar2;
  
  std::__ostream_insert<char,std::char_traits<char>>(stream,"<![CDATA[",9);
  pcVar1 = strstr(data,"]]>");
  if (pcVar1 == (char *)0x0) {
    if (data == (char *)0x0) {
      std::ios::clear((int)stream + (int)*(undefined8 *)(*(long *)stream + -0x18));
      goto LAB_0012fc17;
    }
  }
  else {
    do {
      std::ostream::write((char *)stream,(long)data);
      std::__ostream_insert<char,std::char_traits<char>>(stream,"]]>]]&gt;<![CDATA[",0x12);
      data = pcVar1 + 3;
      pcVar1 = strstr(data,"]]>");
    } while (pcVar1 != (char *)0x0);
  }
  sVar2 = strlen(data);
  std::__ostream_insert<char,std::char_traits<char>>(stream,data,sVar2);
LAB_0012fc17:
  std::__ostream_insert<char,std::char_traits<char>>(stream,"]]>",3);
  return;
}

Assistant:

void XmlUnitTestResultPrinter::OutputXmlCDataSection(::std::ostream* stream,
                                                     const char* data) {
  const char* segment = data;
  *stream << "<![CDATA[";
  for (;;) {
    const char* const next_segment = strstr(segment, "]]>");
    if (next_segment != nullptr) {
      stream->write(
          segment, static_cast<std::streamsize>(next_segment - segment));
      *stream << "]]>]]&gt;<![CDATA[";
      segment = next_segment + strlen("]]>");
    } else {
      *stream << segment;
      break;
    }
  }
  *stream << "]]>";
}